

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O0

int __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>>>
          (exhaustive_solver<baryonyx::itm::minimize_tag,double> *this,int k,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
          *reduced_cost,int r_size)

{
  double dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  type prVar5;
  reference pvVar6;
  pointer pcVar7;
  reference pvVar8;
  iterator iVar9;
  iterator iVar10;
  difference_type dVar11;
  int iVar12;
  int local_124;
  __normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>_>
  local_d8;
  size_type local_d0;
  size_t e;
  size_t i_3;
  item *local_b8;
  item *local_b0;
  __normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>_>
  local_a8;
  __normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>_>
  middle;
  int local_88;
  int local_84;
  int i_2;
  int j_1;
  double z;
  int i_1;
  int j;
  int start_solution;
  int best;
  double z_best;
  iterator iStack_58;
  int i;
  constraint local_4c;
  _Self local_38;
  iterator it_constraint;
  int r_size_local;
  unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
  *reduced_cost_local;
  int k_local;
  exhaustive_solver<baryonyx::itm::minimize_tag,_double> *this_local;
  
  it_constraint._M_node._4_4_ = r_size;
  exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint::constraint(&local_4c,k);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint,_std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>_>
       ::find((set<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint,_std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>_>
               *)(this + 0x48),&local_4c);
  iStack_58 = std::
              set<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint,_std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>_>
              ::end((set<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint,_std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>_>
                     *)(this + 0x48));
  bVar4 = std::operator==(&local_38,&stack0xffffffffffffffa8);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    details::fail_fast("Precondition","it_constraint != constraints.end()",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                       ,"189");
  }
  std::
  vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
  ::resize((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
            *)this,(long)it_constraint._M_node._4_4_);
  for (z_best._4_4_ = 0; z_best._4_4_ != it_constraint._M_node._4_4_;
      z_best._4_4_ = z_best._4_4_ + 1) {
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[](reduced_cost,(long)z_best._4_4_);
    dVar1 = prVar5->value;
    pvVar6 = std::
             vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
             ::operator[]((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                           *)this,(long)z_best._4_4_);
    pvVar6->r = dVar1;
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[](reduced_cost,(long)z_best._4_4_);
    iVar2 = prVar5->id;
    pvVar6 = std::
             vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
             ::operator[]((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                           *)this,(long)z_best._4_4_);
    pvVar6->variable = iVar2;
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[](reduced_cost,(long)z_best._4_4_);
    iVar2 = prVar5->f;
    pvVar6 = std::
             vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
             ::operator[]((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                           *)this,(long)z_best._4_4_);
    pvVar6->factor = iVar2;
    pvVar6 = std::
             vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
             ::operator[]((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                           *)this,(long)z_best._4_4_);
    pvVar6->result = 0;
  }
  _start_solution = 0.0;
  j = 0;
  pcVar7 = std::
           _Rb_tree_const_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>
           ::operator->(&local_38);
  iVar2 = pcVar7->start;
  for (z._4_4_ = 0; z._4_4_ != it_constraint._M_node._4_4_; z._4_4_ = z._4_4_ + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(this + 0x18),(long)(iVar2 + z._4_4_));
    if (*pvVar8 != 0) {
      prVar5 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[](reduced_cost,(long)z._4_4_);
      _start_solution = prVar5->value + _start_solution;
    }
  }
  for (z._0_4_ = 1;
      pcVar7 = std::
               _Rb_tree_const_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>
               ::operator->(&local_38), z._0_4_ != pcVar7->solutions; z._0_4_ = z._0_4_ + 1) {
    pcVar7 = std::
             _Rb_tree_const_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>
             ::operator->(&local_38);
    iVar2 = pcVar7->start;
    iVar12 = z._0_4_ * it_constraint._M_node._4_4_;
    _i_2 = 0.0;
    for (local_84 = 0; local_84 != it_constraint._M_node._4_4_; local_84 = local_84 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(this + 0x18),
                          (long)(iVar2 + iVar12 + local_84));
      if (*pvVar8 != 0) {
        prVar5 = std::
                 unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                 ::operator[](reduced_cost,(long)local_84);
        _i_2 = prVar5->value + _i_2;
      }
    }
    bVar4 = exhaustive_solver<baryonyx::itm::minimize_tag,_double>::is_best_solution
                      ((exhaustive_solver<baryonyx::itm::minimize_tag,_double> *)this,_i_2,
                       _start_solution);
    if (bVar4) {
      _start_solution = _i_2;
      j = z._0_4_;
    }
  }
  pcVar7 = std::
           _Rb_tree_const_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::constraint>
           ::operator->(&local_38);
  iVar2 = pcVar7->start;
  iVar12 = j * it_constraint._M_node._4_4_;
  for (local_88 = 0; local_88 != it_constraint._M_node._4_4_; local_88 = local_88 + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(this + 0x18),
                        (long)(iVar2 + iVar12 + local_88));
    iVar3 = *pvVar8;
    pvVar6 = std::
             vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
             ::operator[]((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                           *)this,(long)local_88);
    pvVar6->result = (uint)(iVar3 != 0);
  }
  iVar9 = std::
          begin<std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item>>>
                    ((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                      *)this);
  iVar10 = std::
           end<std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item>>>
                     ((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                       *)this);
  std::
  sort<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item>>>,baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>>&,int)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar9._M_current,iVar10._M_current);
  local_b0 = (item *)std::
                     begin<std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item>>>
                               ((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                                 *)this);
  local_b8 = (item *)std::
                     end<std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item>>>
                               ((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                                 *)this);
  local_a8 = std::
             find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item>>>,baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>>&,int)::_lambda(auto:1_const&)_1_>
                       (local_b0,local_b8);
  e = 0;
  local_d0 = std::
             vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
             ::size((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                     *)this);
  for (; e != local_d0; e = e + 1) {
    pvVar6 = std::
             vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
             ::operator[]((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                           *)this,e);
    dVar1 = pvVar6->r;
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[](reduced_cost,e);
    prVar5->value = dVar1;
    pvVar6 = std::
             vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
             ::operator[]((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                           *)this,e);
    iVar2 = pvVar6->variable;
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[](reduced_cost,e);
    prVar5->id = iVar2;
    pvVar6 = std::
             vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
             ::operator[]((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                           *)this,e);
    iVar2 = pvVar6->factor;
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[](reduced_cost,e);
    prVar5->f = iVar2;
  }
  local_d8._M_current =
       (item *)std::
               end<std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item>>>
                         ((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                           *)this);
  bVar4 = __gnu_cxx::
          operator==<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>_>
                    (&local_a8,&local_d8);
  if (bVar4) {
    pvVar6 = std::
             vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
             ::operator[]((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                           *)this,0);
    if (pvVar6->result == 0) {
      local_124 = -1;
    }
    else {
      local_124 = it_constraint._M_node._4_4_;
    }
    this_local._4_4_ = local_124;
  }
  else {
    iVar9 = std::
            begin<std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item>>>
                      ((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
                        *)this);
    dVar11 = std::
             distance<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,double>::item>>>>
                       ((__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>_>
                         )iVar9._M_current,local_a8);
    this_local._4_4_ = (int)dVar11 + -1;
  }
  return this_local._4_4_;
}

Assistant:

int solve(int k, R& reduced_cost, int r_size)
    {
        const auto it_constraint = constraints.find(k);
        bx_expects(it_constraint != constraints.end());

        items.resize(r_size);
        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].factor = reduced_cost[i].f;
            items[i].result = 0;
        }

        Float z_best = 0;
        auto best = 0;
        auto start_solution = it_constraint->start;

        for (int j = 0; j != r_size; ++j)
            if (flat_constraints[start_solution + j])
                z_best += reduced_cost[j].value;

        for (auto i = 1; i != it_constraint->solutions; ++i) {
            start_solution = it_constraint->start + (i * r_size);

            Float z = 0;
            for (int j = 0; j != r_size; ++j)
                if (flat_constraints[start_solution + j])
                    z += reduced_cost[j].value;

            if (is_best_solution(z, z_best)) {
                z_best = z;
                best = i;
            }
        }

        start_solution = it_constraint->start + (best * r_size);
        for (int i = 0; i != r_size; ++i)
            items[i].result = flat_constraints[start_solution + i] ? 1 : 0;

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }